

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall
cmOrderDirectories::AddRuntimeLibrary(cmOrderDirectories *this,string *fullPath,char *soname)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  pointer *__ptr;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  string local_98;
  char *soname_local;
  string dir;
  string local_50;
  _Alloc_hider local_30;
  
  soname_local = soname;
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->EmmittedConstraintSOName,fullPath);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if ((this->ImplicitDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      cmsys::SystemTools::GetFilenamePath(&dir,fullPath);
      lVar3 = std::__cxx11::string::rfind((char *)fullPath,0x722701);
      if (lVar3 != -1) {
        if ((AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)::splitFramework == '\0') &&
           (iVar2 = __cxa_guard_acquire(&AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)
                                         ::splitFramework), iVar2 != 0)) {
          cmsys::RegularExpression::RegularExpression
                    (&AddRuntimeLibrary::splitFramework,"^(.*)/(.*).framework/(.*)$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &AddRuntimeLibrary::splitFramework,&__dso_handle);
          __cxa_guard_release(&AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)::
                               splitFramework);
        }
        bVar1 = cmsys::RegularExpression::find(&AddRuntimeLibrary::splitFramework,fullPath);
        if (bVar1) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_98,&AddRuntimeLibrary::splitFramework.regmatch,3);
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_50,&AddRuntimeLibrary::splitFramework.regmatch,2);
          lVar3 = std::__cxx11::string::find((string *)&local_98,(ulong)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_98);
          if (lVar3 != -1) {
            cmsys::RegularExpressionMatch::match_abi_cxx11_
                      (&local_98,&AddRuntimeLibrary::splitFramework.regmatch,1);
            std::__cxx11::string::operator=((string *)&dir,(string *)&local_98);
            std::__cxx11::string::~string((string *)&local_98);
          }
        }
      }
      bVar1 = IsImplicitDirectory(this,&dir);
      if (bVar1) {
        local_30._M_p = (pointer)this;
        std::
        make_unique<cmOrderDirectoriesConstraintSOName,cmOrderDirectories*,std::__cxx11::string_const&,char_const*&>
                  ((cmOrderDirectories **)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30,
                   (char **)fullPath);
        local_98._M_dataplus._M_p = local_50._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)0x0;
        std::
        vector<std::unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>,std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>>>
        ::
        emplace_back<std::unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>>
                  ((vector<std::unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>,std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>>>
                    *)&this->ImplicitDirEntries,
                   (unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
                    *)&local_98);
        if ((long *)local_98._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
        }
        local_98._M_dataplus._M_p = (pointer)0x0;
        if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
        }
        std::__cxx11::string::~string((string *)&dir);
        return;
      }
      std::__cxx11::string::~string((string *)&dir);
    }
    local_50._M_dataplus._M_p = (pointer)this;
    std::
    make_unique<cmOrderDirectoriesConstraintSOName,cmOrderDirectories*,std::__cxx11::string_const&,char_const*&>
              ((cmOrderDirectories **)&local_98,&local_50,(char **)fullPath);
    dir._M_dataplus._M_p = local_98._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)0x0;
    std::
    vector<std::unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>,std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>>>
    ::
    emplace_back<std::unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>>
              ((vector<std::unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>,std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>>>
                *)&this->ConstraintEntries,
               (unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
                *)&dir);
    if (dir._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)dir._M_dataplus._M_p + 8))();
    }
    dir._M_dataplus._M_p = (pointer)0x0;
    if ((long *)local_98._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
    }
  }
  return;
}

Assistant:

void cmOrderDirectories::AddRuntimeLibrary(std::string const& fullPath,
                                           const char* soname)
{
  // Add the runtime library at most once.
  if (this->EmmittedConstraintSOName.insert(fullPath).second) {
    // Implicit link directories need special handling.
    if (!this->ImplicitDirectories.empty()) {
      std::string dir = cmSystemTools::GetFilenamePath(fullPath);

      if (fullPath.rfind(".framework") != std::string::npos) {
        static cmsys::RegularExpression splitFramework(
          "^(.*)/(.*).framework/(.*)$");
        if (splitFramework.find(fullPath) &&
            (std::string::npos !=
             splitFramework.match(3).find(splitFramework.match(2)))) {
          dir = splitFramework.match(1);
        }
      }

      if (this->IsImplicitDirectory(dir)) {
        this->ImplicitDirEntries.push_back(
          cm::make_unique<cmOrderDirectoriesConstraintSOName>(this, fullPath,
                                                              soname));
        return;
      }
    }

    // Construct the runtime information entry for this library.
    this->ConstraintEntries.push_back(
      cm::make_unique<cmOrderDirectoriesConstraintSOName>(this, fullPath,
                                                          soname));
  } else {
    // This can happen if the same library is linked multiple times.
    // In that case the runtime information check need be done only
    // once anyway.  For shared libs we could add a check in AddItem
    // to not repeat them.
  }
}